

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase793::run(TestCase793 *this)

{
  size_t sVar1;
  word *pwVar2;
  size_t sVar3;
  word *pwVar4;
  bool bVar5;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar6;
  Reader value;
  Reader value_00;
  uint local_16c;
  Builder local_168;
  Builder root;
  OrphanBuilder local_128;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  sVar1 = (AVar6.ptr)->size_;
  pwVar2 = (AVar6.ptr)->ptr;
  value = _::data("abcd123");
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataField(&root,value);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  sVar3 = (AVar6.ptr)->size_;
  pwVar4 = (AVar6.ptr)->ptr;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&root,value_00);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  if ((AVar6.size_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_16c = 1;
    AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    local_168._0_8_ = AVar6.size_;
    kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x323,ERROR,
               "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
               ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
               &local_16c,(unsigned_long *)&local_168);
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownDataField
            ((Orphan<capnp::Data> *)&local_128,&root);
  OrphanBuilder::~OrphanBuilder(&local_128);
  bVar5 = allZero(pwVar2 + sVar1,pwVar4 + sVar3);
  if ((!bVar5) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x327,ERROR,"\"failed: expected \" \"allZero(zerosStart, zerosEnd)\"",
               (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_168,&root);
  bVar5 = operator==("foo",&local_168);
  if (!bVar5 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_168,&root);
    kj::_::Debug::log<char_const(&)[50],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x329,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", \"foo\", root.getTextField()"
               ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
               (char (*) [4])"foo",&local_168);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, DataZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  root.setDataField(data("abcd123"));
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownDataField();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}